

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gems.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Diamond *pDVar1;
  char *__s;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Diamond *pDVar5;
  ostream *poVar6;
  size_t sVar7;
  unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_> *d;
  ulong uVar8;
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  bling;
  allocator<char> local_39;
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  local_38;
  
  uVar3 = 10;
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,argv[1],&local_39);
    iVar2 = std::__cxx11::string::compare((char *)&local_38);
    if (local_38.
        super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_38.
                  super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_38.
                      super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_38.
                                       super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<gems::Diamond,_std::default_delete<gems::Diamond>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gems::Diamond_*,_std::default_delete<gems::Diamond>_>
                                     .super__Head_base<0UL,_gems::Diamond_*,_false>._M_head_impl + 1
                             ));
    }
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage:",6);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
      __s = *argv;
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1060d0);
      }
      else {
        sVar7 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," [N]",4);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Options:",8);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\tN\t\tNumber of diamonds [default: 10]",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      return 0;
    }
    uVar3 = atoi(argv[1]);
  }
  std::
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  ::vector(&local_38,(long)(int)uVar3,(allocator_type *)&local_39);
  if (0 < (int)uVar3) {
    uVar8 = 0;
    do {
      pDVar5 = (Diamond *)operator_new(4);
      pDVar5->lifespan = FOREVER;
      pDVar1 = local_38.
               super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
               super___uniq_ptr_impl<gems::Diamond,_std::default_delete<gems::Diamond>_>._M_t.
               super__Tuple_impl<0UL,_gems::Diamond_*,_std::default_delete<gems::Diamond>_>.
               super__Head_base<0UL,_gems::Diamond_*,_false>._M_head_impl;
      local_38.
      super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
      super___uniq_ptr_impl<gems::Diamond,_std::default_delete<gems::Diamond>_>._M_t.
      super__Tuple_impl<0UL,_gems::Diamond_*,_std::default_delete<gems::Diamond>_>.
      super__Head_base<0UL,_gems::Diamond_*,_false>._M_head_impl = pDVar5;
      if (pDVar1 != (Diamond *)0x0) {
        operator_delete(pDVar1,4);
      }
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  uVar4 = 0;
  for (; local_38.
         super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_38.
         super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_38.
      super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_38.
           super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    uVar4 = uVar4 + ((((local_38.
                        super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<gems::Diamond,_std::default_delete<gems::Diamond>_>._M_t
                      .super__Tuple_impl<0UL,_gems::Diamond_*,_std::default_delete<gems::Diamond>_>.
                      super__Head_base<0UL,_gems::Diamond_*,_false>._M_head_impl)->lifespan ==
                    FOREVER);
  }
  if (uVar4 == uVar3) {
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," diamonds are forever",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  else {
    poVar6 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Looks ike cubic zirconium to me",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  }
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  ::~vector(&local_38);
  return 0;
}

Assistant:

int main(int argc, char **argv)
    {
        int n = 10;
        if(argc > 1) {
            if(std::string(argv[1]) == "-h") {
                std::cerr << "Usage:" << std::endl;
                std::cerr << "\t" << argv[0] << " [N]" << std::endl;
                std::cerr << std::endl;
                std::cerr << "Options:" << std::endl;
                std::cerr << "\tN\t\tNumber of diamonds [default: 10]";
                std::cerr << std::endl;
                return 0;
            }
            n = std::atoi(argv[1]);
        }

        std::vector<std::unique_ptr<Diamond>> bling(n);
        for(int i = 0; i < n; i++) {
            bling[i] = std::unique_ptr<Diamond>(new Diamond());
        }

        int is_forever = 0;
        for(auto &d : bling) {
            is_forever += int(d->get_lifespan() == FOREVER);
        }

        if(is_forever == n) {
            std::cout << n << " diamonds are forever" << std::endl;
        }
        else {
            std::cout << "Looks ike cubic zirconium to me" << std::endl;
        }

        return 0;
    }